

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void * rw::ps2::driverOpen(void *o,int32 param_2,int32 param_3)

{
  ObjPipeline *pOVar1;
  int32 param_2_local;
  int32 param_1_local;
  void *o_local;
  
  pOVar1 = makeDefaultPipeline();
  **(undefined8 **)(engine + 0x40) = pOVar1;
  *(undefined4 *)(*(long *)(engine + 0x40) + 8) = nativeRasterOffset;
  *(code **)(*(long *)(engine + 0x40) + 0x10) = rasterCreate;
  *(code **)(*(long *)(engine + 0x40) + 0x18) = rasterLock;
  *(code **)(*(long *)(engine + 0x40) + 0x20) = rasterUnlock;
  *(code **)(*(long *)(engine + 0x40) + 0x28) = rasterLockPalette;
  *(code **)(*(long *)(engine + 0x40) + 0x30) = rasterUnlockPalette;
  *(code **)(*(long *)(engine + 0x40) + 0x38) = rasterNumLevels;
  *(code **)(*(long *)(engine + 0x40) + 0x40) = imageFindRasterFormat;
  *(code **)(*(long *)(engine + 0x40) + 0x48) = rasterFromImage;
  *(code **)(*(long *)(engine + 0x40) + 0x50) = rasterToImage;
  return o;
}

Assistant:

static void*
driverOpen(void *o, int32, int32)
{
	engine->driver[PLATFORM_PS2]->defaultPipeline = makeDefaultPipeline();

	engine->driver[PLATFORM_PS2]->rasterNativeOffset = nativeRasterOffset;
	engine->driver[PLATFORM_PS2]->rasterCreate = rasterCreate;
	engine->driver[PLATFORM_PS2]->rasterLock = rasterLock;
	engine->driver[PLATFORM_PS2]->rasterUnlock = rasterUnlock;
	engine->driver[PLATFORM_PS2]->rasterLockPalette = rasterLockPalette;
	engine->driver[PLATFORM_PS2]->rasterUnlockPalette = rasterUnlockPalette;
	engine->driver[PLATFORM_PS2]->rasterNumLevels = rasterNumLevels;
	engine->driver[PLATFORM_PS2]->imageFindRasterFormat = imageFindRasterFormat;
	engine->driver[PLATFORM_PS2]->rasterFromImage = rasterFromImage;
	engine->driver[PLATFORM_PS2]->rasterToImage = rasterToImage;

	return o;
}